

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shadow-params.cc
# Opt level: O1

void __thiscall cnn::ShadowParameters::ShadowParameters(ShadowParameters *this,Parameters *p)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  byte bVar5;
  byte bVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  float *pfVar12;
  ulong uVar13;
  ulong uVar14;
  ushort uVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  int iVar23;
  
  uVar4 = *(undefined8 *)(p->values).d.d;
  uVar7 = *(undefined8 *)((p->values).d.d + 2);
  uVar8 = *(undefined8 *)((p->values).d.d + 4);
  uVar9 = *(undefined8 *)((p->values).d.d + 6);
  uVar10 = *(undefined8 *)((p->values).d.d + 6);
  uVar11 = *(undefined8 *)&(p->values).d.bd;
  pfVar12 = (p->values).v;
  *(undefined8 *)((this->h).d.d + 4) = *(undefined8 *)((p->values).d.d + 4);
  *(undefined8 *)((this->h).d.d + 6) = uVar10;
  *(undefined8 *)&(this->h).d.bd = uVar11;
  (this->h).v = pfVar12;
  *(undefined8 *)(this->h).d.d = uVar4;
  *(undefined8 *)((this->h).d.d + 2) = uVar7;
  *(undefined8 *)((this->h).d.d + 4) = uVar8;
  *(undefined8 *)((this->h).d.d + 6) = uVar9;
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::vector(&(this->h).bs,&(p->values).bs);
  uVar13 = (ulong)(this->h).d.nd;
  if (uVar13 == 0) {
    iVar23 = 1;
  }
  else {
    auVar17 = vpbroadcastq_avx512f();
    auVar18 = vpbroadcastd_avx512f(ZEXT416(1));
    uVar14 = 0;
    auVar19 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    do {
      auVar21 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar22 = vporq_avx512f(auVar18,auVar19);
      auVar18 = vporq_avx512f(auVar18,auVar20);
      uVar4 = vpcmpuq_avx512f(auVar18,auVar17,2);
      bVar5 = (byte)uVar4;
      uVar4 = vpcmpuq_avx512f(auVar22,auVar17,2);
      bVar6 = (byte)uVar4;
      uVar15 = CONCAT11(bVar6,bVar5);
      auVar18 = vmovdqu32_avx512f(*(undefined1 (*) [64])((this->h).d.d + uVar14));
      auVar22._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar18._4_4_;
      auVar22._0_4_ = (uint)(bVar5 & 1) * auVar18._0_4_;
      auVar22._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar18._8_4_;
      auVar22._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar18._12_4_;
      auVar22._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * auVar18._16_4_;
      auVar22._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * auVar18._20_4_;
      auVar22._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * auVar18._24_4_;
      auVar22._28_4_ = (uint)((byte)(uVar15 >> 7) & 1) * auVar18._28_4_;
      auVar22._32_4_ = (uint)(bVar6 & 1) * auVar18._32_4_;
      auVar22._36_4_ = (uint)(bVar6 >> 1 & 1) * auVar18._36_4_;
      auVar22._40_4_ = (uint)(bVar6 >> 2 & 1) * auVar18._40_4_;
      auVar22._44_4_ = (uint)(bVar6 >> 3 & 1) * auVar18._44_4_;
      auVar22._48_4_ = (uint)(bVar6 >> 4 & 1) * auVar18._48_4_;
      auVar22._52_4_ = (uint)(bVar6 >> 5 & 1) * auVar18._52_4_;
      auVar22._56_4_ = (uint)(bVar6 >> 6 & 1) * auVar18._56_4_;
      auVar22._60_4_ = (uint)(bVar6 >> 7) * auVar18._60_4_;
      auVar18 = vpmulld_avx512f(auVar22,auVar21);
      uVar14 = uVar14 + 0x10;
    } while ((uVar13 + 0xf & 0xfffffffffffffff0) != uVar14);
    auVar17 = vmovdqa32_avx512f(auVar18);
    auVar18._0_4_ = (uint)(bVar5 & 1) * auVar17._0_4_ | (uint)!(bool)(bVar5 & 1) * auVar21._0_4_;
    bVar1 = (bool)((byte)(uVar15 >> 1) & 1);
    auVar18._4_4_ = (uint)bVar1 * auVar17._4_4_ | (uint)!bVar1 * auVar21._4_4_;
    bVar1 = (bool)((byte)(uVar15 >> 2) & 1);
    auVar18._8_4_ = (uint)bVar1 * auVar17._8_4_ | (uint)!bVar1 * auVar21._8_4_;
    bVar1 = (bool)((byte)(uVar15 >> 3) & 1);
    auVar18._12_4_ = (uint)bVar1 * auVar17._12_4_ | (uint)!bVar1 * auVar21._12_4_;
    bVar1 = (bool)((byte)(uVar15 >> 4) & 1);
    auVar18._16_4_ = (uint)bVar1 * auVar17._16_4_ | (uint)!bVar1 * auVar21._16_4_;
    bVar1 = (bool)((byte)(uVar15 >> 5) & 1);
    auVar18._20_4_ = (uint)bVar1 * auVar17._20_4_ | (uint)!bVar1 * auVar21._20_4_;
    bVar1 = (bool)((byte)(uVar15 >> 6) & 1);
    auVar18._24_4_ = (uint)bVar1 * auVar17._24_4_ | (uint)!bVar1 * auVar21._24_4_;
    bVar1 = (bool)((byte)(uVar15 >> 7) & 1);
    auVar18._28_4_ = (uint)bVar1 * auVar17._28_4_ | (uint)!bVar1 * auVar21._28_4_;
    auVar18._32_4_ = (uint)(bVar6 & 1) * auVar17._32_4_ | (uint)!(bool)(bVar6 & 1) * auVar21._32_4_;
    bVar1 = (bool)(bVar6 >> 1 & 1);
    auVar18._36_4_ = (uint)bVar1 * auVar17._36_4_ | (uint)!bVar1 * auVar21._36_4_;
    bVar1 = (bool)(bVar6 >> 2 & 1);
    auVar18._40_4_ = (uint)bVar1 * auVar17._40_4_ | (uint)!bVar1 * auVar21._40_4_;
    bVar1 = (bool)(bVar6 >> 3 & 1);
    auVar18._44_4_ = (uint)bVar1 * auVar17._44_4_ | (uint)!bVar1 * auVar21._44_4_;
    bVar1 = (bool)(bVar6 >> 4 & 1);
    auVar18._48_4_ = (uint)bVar1 * auVar17._48_4_ | (uint)!bVar1 * auVar21._48_4_;
    bVar1 = (bool)(bVar6 >> 5 & 1);
    auVar18._52_4_ = (uint)bVar1 * auVar17._52_4_ | (uint)!bVar1 * auVar21._52_4_;
    bVar1 = (bool)(bVar6 >> 6 & 1);
    auVar18._56_4_ = (uint)bVar1 * auVar17._56_4_ | (uint)!bVar1 * auVar21._56_4_;
    auVar18._60_4_ =
         (uint)(bVar6 >> 7) * auVar17._60_4_ | (uint)!(bool)(bVar6 >> 7) * auVar21._60_4_;
    auVar16 = vextracti64x4_avx512f(auVar18,1);
    auVar17 = vpmulld_avx512f(auVar18,ZEXT3264(auVar16));
    auVar2 = vpmulld_avx(auVar17._0_16_,auVar17._16_16_);
    auVar3 = vpshufd_avx(auVar2,0xee);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    auVar3 = vpshufd_avx(auVar2,0x55);
    auVar2 = vpmulld_avx(auVar2,auVar3);
    iVar23 = auVar2._0_4_;
  }
  pfVar12 = (float *)cnn_mm_malloc((ulong)(iVar23 * (this->h).d.bd) << 2,0x100);
  (this->h).v = pfVar12;
  TensorTools::Zero(&this->h);
  return;
}

Assistant:

ShadowParameters::ShadowParameters(const Parameters& p) : h(p.values) {
  h.v = (float*)cnn_mm_malloc(h.d.size() * sizeof(float), 256);
  TensorTools::Zero(h);
}